

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void __thiscall PingPong::~PingPong(PingPong *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->pong).impl.
              super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->do_exit).impl.
              super___shared_ptr<actorpp::detail::ChannelImpl<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->ping).impl.
              super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->super_Actor).impl.
              super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

PingPong(Channel<int> pong) : ping(*this), do_exit(*this), pong(pong) {}